

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SchemaClear(void *p)

{
  CollSeq *pCVar1;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  Table *pTab;
  Schema *pSchema;
  HashElem *pElem;
  Hash temp2;
  Hash temp1;
  sqlite3 xdb;
  Trigger *in_stack_fffffffffffffc98;
  CollSeq *local_358;
  undefined1 local_318 [784];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_318,&DAT_002ab0f8,0x310);
  memset(local_318,0,0x310);
  pCVar1 = in_RDI->pDfltColl;
  local_358 = (CollSeq *)in_RDI->szMmap;
  sqlite3HashInit((Hash *)&in_RDI->lastRowid);
  sqlite3HashClear((Hash *)in_RDI);
  for (; local_358 != (CollSeq *)0x0; local_358 = *(CollSeq **)local_358) {
    sqlite3DeleteTrigger(in_RDI,in_stack_fffffffffffffc98);
  }
  sqlite3HashClear((Hash *)in_RDI);
  sqlite3HashInit((Hash *)&in_RDI->pVdbe);
  for (local_358 = pCVar1; local_358 != (CollSeq *)0x0; local_358 = (CollSeq *)local_358->zName) {
    sqlite3DeleteTable(in_RDI,(Table *)local_358->pUser);
  }
  sqlite3HashClear((Hash *)in_RDI);
  sqlite3HashClear((Hash *)in_RDI);
  in_RDI->bBenignMalloc = '\0';
  in_RDI->dfltLockMode = '\0';
  in_RDI->nextAutovac = '\0';
  in_RDI->suppressErr = '\0';
  in_RDI->vtabOnConflict = '\0';
  in_RDI->isTransactionSavepoint = '\0';
  in_RDI->mTrace = '\0';
  in_RDI->noSharedCache = '\0';
  if ((*(ushort *)&in_RDI->field_0x72 & 1) != 0) {
    *(int *)((long)&in_RDI->pVfs + 4) = *(int *)((long)&in_RDI->pVfs + 4) + 1;
  }
  *(ushort *)&in_RDI->field_0x72 = *(ushort *)&in_RDI->field_0x72 & 0xfff6;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3SchemaClear(void *p){
  Hash temp1;
  Hash temp2;
  HashElem *pElem;
  Schema *pSchema = (Schema *)p;
  sqlite3 xdb;

  memset(&xdb, 0, sizeof(xdb));
  temp1 = pSchema->tblHash;
  temp2 = pSchema->trigHash;
  sqlite3HashInit(&pSchema->trigHash);
  sqlite3HashClear(&pSchema->idxHash);
  for(pElem=sqliteHashFirst(&temp2); pElem; pElem=sqliteHashNext(pElem)){
    sqlite3DeleteTrigger(&xdb, (Trigger*)sqliteHashData(pElem));
  }
  sqlite3HashClear(&temp2);
  sqlite3HashInit(&pSchema->tblHash);
  for(pElem=sqliteHashFirst(&temp1); pElem; pElem=sqliteHashNext(pElem)){
    Table *pTab = sqliteHashData(pElem);
    sqlite3DeleteTable(&xdb, pTab);
  }
  sqlite3HashClear(&temp1);
  sqlite3HashClear(&pSchema->fkeyHash);
  pSchema->pSeqTab = 0;
  if( pSchema->schemaFlags & DB_SchemaLoaded ){
    pSchema->iGeneration++;
  }
  pSchema->schemaFlags &= ~(DB_SchemaLoaded|DB_ResetWanted);
}